

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

bool __thiscall libcellml::XmlNode::isInteger(XmlNode *this)

{
  bool bVar1;
  int dummyInt;
  int local_2c;
  string local_28;
  
  convertToStrippedString_abi_cxx11_(&local_28,this);
  bVar1 = convertToInt(&local_28,&local_2c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool XmlNode::isInteger() const
{
    int dummyInt;
    return convertToInt(convertToStrippedString(), dummyInt);
}